

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_sampling.cpp
# Opt level: O0

Id dxil_spv::emit_query_size(Impl *impl,Id image_id,bool array,Id lod_id)

{
  Id IVar1;
  Op op;
  Id type_id;
  Builder *this;
  Operation *this_00;
  int size;
  Operation *extract;
  Operation *query_size_level_zero;
  Id i32_type;
  Builder *builder;
  Id lod_id_local;
  bool array_local;
  Id image_id_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  IVar1 = spv::Builder::makeIntType(this,0x20);
  op = OpImageQuerySize;
  if (lod_id != 0) {
    op = OpImageQuerySizeLod;
  }
  size = 2;
  if (array) {
    size = 3;
  }
  type_id = spv::Builder::makeVectorType(this,IVar1,size);
  this_00 = Converter::Impl::allocate(impl,op,type_id);
  Operation::add_id(this_00,image_id);
  if (lod_id != 0) {
    Operation::add_id(this_00,lod_id);
  }
  Converter::Impl::add(impl,this_00,false);
  extract = this_00;
  if (array) {
    IVar1 = spv::Builder::makeVectorType(this,IVar1,2);
    extract = Converter::Impl::allocate(impl,OpVectorShuffle,IVar1);
    Operation::add_id(extract,this_00->id);
    Operation::add_id(extract,this_00->id);
    Operation::add_literal(extract,0);
    Operation::add_literal(extract,1);
    Converter::Impl::add(impl,extract,false);
  }
  return extract->id;
}

Assistant:

static spv::Id emit_query_size(Converter::Impl &impl, spv::Id image_id,
                               bool array, spv::Id lod_id = 0)
{
	auto &builder = impl.builder();
	spv::Id i32_type = builder.makeIntType(32);

	auto *query_size_level_zero = impl.allocate(
		lod_id ? spv::OpImageQuerySizeLod : spv::OpImageQuerySize,
		builder.makeVectorType(i32_type, array ? 3 : 2));
	query_size_level_zero->add_id(image_id);
	if (lod_id)
		query_size_level_zero->add_id(lod_id);
	impl.add(query_size_level_zero);

	if (array)
	{
		auto *extract = impl.allocate(spv::OpVectorShuffle, builder.makeVectorType(i32_type, 2));
		extract->add_id(query_size_level_zero->id);
		extract->add_id(query_size_level_zero->id);
		extract->add_literal(0);
		extract->add_literal(1);
		impl.add(extract);

		query_size_level_zero = extract;
	}

	return query_size_level_zero->id;
}